

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowMinAbsUnscaled
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,
          SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,int i)

{
  double a;
  int iVar1;
  int iVar2;
  DataArray<int> *pDVar3;
  DataArray<int> *pDVar4;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  uint uVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  bool bVar8;
  int *piVar9;
  long lVar10;
  bool bVar11;
  int *piVar12;
  uint *puVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  uint *puVar15;
  soplex *psVar16;
  uint *puVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  long lVar19;
  Item *pIVar20;
  long lVar21;
  long in_FS_OFFSET;
  byte bVar22;
  Real eps;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_29c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_21c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_19c;
  soplex local_11c [112];
  int local_ac;
  undefined1 local_a8;
  undefined8 local_a4;
  uint local_9c [27];
  
  bVar22 = 0;
  pDVar3 = this->m_activeColscaleExp;
  pDVar4 = this->m_activeRowscaleExp;
  pIVar20 = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  ::soplex::infinity::__tls_init();
  a = *(double *)(in_FS_OFFSET + -8);
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x11] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x12] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x13] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x14] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x15] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x16] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x17] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x18] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x19] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1a] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,a);
  if (0 < (pIVar20->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    iVar1 = pDVar4->data[i];
    lVar19 = 0x80;
    lVar21 = 0;
    do {
      piVar9 = (int *)((long)&(((pIVar20->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val).m_backend.data + lVar19);
      iVar2 = pDVar3->data[*piVar9];
      piVar12 = piVar9 + -0x20;
      psVar16 = local_11c;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *(int *)psVar16 = *piVar12;
        piVar12 = piVar12 + (ulong)bVar22 * -2 + 1;
        psVar16 = psVar16 + (ulong)bVar22 * -8 + 4;
      }
      local_ac = piVar9[-4];
      local_a8 = (undefined1)piVar9[-3];
      local_a4 = *(undefined8 *)(piVar9 + -2);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                (&local_21c,local_11c,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)(uint)-(iVar2 + iVar1),CONCAT31((int3)((uint)local_ac >> 8),local_a8));
      iVar7 = local_21c.m_backend.prec_elem;
      fVar6 = local_21c.m_backend.fpclass;
      iVar2 = local_21c.m_backend.exp;
      uVar5 = local_21c.m_backend.data._M_elems[0];
      bVar11 = local_21c.m_backend.neg;
      if (local_21c.m_backend.neg == true) {
        bVar11 = local_21c.m_backend.fpclass == cpp_dec_float_finite &&
                 local_21c.m_backend.data._M_elems[0] == 0;
      }
      puVar15 = local_21c.m_backend.data._M_elems + 1;
      puVar13 = puVar15;
      puVar17 = local_9c;
      for (lVar10 = 0x1b; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar17 = *puVar13;
        puVar13 = puVar13 + (ulong)bVar22 * -2 + 1;
        puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
      }
      local_29c.m_backend.data._M_elems[0] = local_21c.m_backend.data._M_elems[0];
      puVar13 = local_29c.m_backend.data._M_elems + 1;
      for (lVar10 = 0x1b; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar13 = *puVar15;
        puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar22 * -2 + 1;
      }
      local_29c.m_backend.exp = iVar2;
      local_29c.m_backend.fpclass = fVar6;
      local_29c.m_backend.prec_elem = iVar7;
      pnVar14 = __return_storage_ptr__;
      pnVar18 = &local_19c;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      local_19c.m_backend.exp = (__return_storage_ptr__->m_backend).exp;
      local_19c.m_backend.neg = (__return_storage_ptr__->m_backend).neg;
      local_19c.m_backend.fpclass = (__return_storage_ptr__->m_backend).fpclass;
      local_19c.m_backend.prec_elem = (__return_storage_ptr__->m_backend).prec_elem;
      this_00 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_01 = (this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      local_29c.m_backend.neg = bVar11;
      eps = Tolerances::epsilon(this_00);
      bVar8 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_29c,&local_19c,eps);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (bVar8) {
        (__return_storage_ptr__->m_backend).data._M_elems[0] = uVar5;
        puVar15 = local_9c;
        puVar13 = (__return_storage_ptr__->m_backend).data._M_elems + 1;
        for (lVar10 = 0x1b; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar13 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
          puVar13 = puVar13 + (ulong)bVar22 * -2 + 1;
        }
        (__return_storage_ptr__->m_backend).exp = iVar2;
        (__return_storage_ptr__->m_backend).neg = bVar11;
        (__return_storage_ptr__->m_backend).fpclass = fVar6;
        (__return_storage_ptr__->m_backend).prec_elem = iVar7;
      }
      lVar21 = lVar21 + 1;
      lVar19 = lVar19 + 0x84;
    } while (lVar21 < (pIVar20->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::getRowMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nRows());
   assert(i >= 0);
   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& rowVec = lp.LPRowSetBase<R>::rowVector(i);

   R min = R(infinity);

   int exp1;
   int exp2 = rowscaleExp[i];

   for(int j = 0; j < rowVec.size(); j++)
   {
      exp1 = colscaleExp[rowVec.index(j)];
      R abs = spxAbs(spxLdexp(rowVec.value(j), -exp1 - exp2));

      if(LT(abs, min, this->tolerances()->epsilon()))
         min = abs;
   }

   return min;
}